

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::PatchableRootProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint cacheId,bool isLoadMethod,bool isStore,
          bool registerCacheIdForCall)

{
  code *pcVar1;
  undefined4 reg;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *functionBody;
  Phase phase;
  undefined7 in_register_00000081;
  CacheIdUnit local_44;
  CacheIdUnit unit;
  OpCode local_32;
  RegSlot value_local;
  OpCode op_local;
  
  unit._4_4_ = value;
  local_32 = op;
  CheckOpen(this);
  CheckOp(this,local_32,(OpLayoutType)0x38);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_32);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x773,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_008a0c4f;
    *puVar3 = 0;
  }
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x774,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar2) goto LAB_008a0c4f;
    *puVar3 = 0;
  }
  reg = unit._4_4_;
  if (unit._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar2) {
      *puVar3 = 0;
      Throw::InternalError();
    }
    goto LAB_008a0c4f;
  }
  if (this->m_functionWrite == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    unit.cacheId = (uint)CONCAT71(in_register_00000081,isLoadMethod);
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar2) goto LAB_008a0c4f;
    *puVar3 = 0;
    isLoadMethod = SUB41(unit.cacheId,0);
  }
  unit._4_4_ = FunctionBody::MapRegSlot(this->m_functionWrite,reg);
  if (local_32 < StRootFld) {
    if (local_32 < LdRootFld) {
      if ((local_32 != InitRootLetFld) && (local_32 != InitRootConstFld)) goto LAB_008a0b93;
    }
    else {
      if (local_32 != LdRootFld) {
        if (local_32 == LdRootMethodFld) {
          if (registerCacheIdForCall) {
            local_44.isRootObjectCache = true;
            local_44.cacheId = cacheId;
            bVar2 = JsUtil::
                    BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::TryGetValue<unsigned_int>
                              (this->callRegToLdFldCacheIndexMap,(uint *)&unit.isRootObjectCache,
                               &local_44);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0x789,
                                          "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))"
                                          ,"!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)"
                                         );
              if (!bVar2) goto LAB_008a0c4f;
              *puVar3 = 0;
            }
            JsUtil::
            BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)this->callRegToLdFldCacheIndexMap,(uint *)&unit.isRootObjectCache,
                       &local_44);
          }
          goto LAB_008a0a93;
        }
        goto LAB_008a0b93;
      }
LAB_008a0a3f:
      bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if ((((!bVar2) &&
           (bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite), !bVar2)
           ) && (bVar2 = DynamicProfileInfo::IsEnabled(ObjTypeSpecPhase,this->m_functionWrite),
                !bVar2)) && (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar2)) {
        functionBody = this->m_functionWrite;
        phase = ProfileBasedFldFastPathPhase;
LAB_008a0ac1:
        bVar2 = DynamicProfileInfo::IsEnabled(phase,functionBody);
        if (!bVar2) goto LAB_008a0ad3;
      }
LAB_008a0aca:
      OpCodeUtil::ConvertNonCallOpToProfiled(&local_32);
    }
  }
  else {
    if (local_32 < InitRootFld) {
      if ((local_32 == StRootFld) || (local_32 == StRootFldStrict)) {
LAB_008a0a93:
        bVar2 = DynamicProfileInfo::IsEnabled(ProfileBasedFldFastPathPhase,this->m_functionWrite);
        if ((!bVar2) && (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false), !bVar2)) {
          functionBody = this->m_functionWrite;
          phase = ObjTypeSpecPhase;
          goto LAB_008a0ac1;
        }
        goto LAB_008a0aca;
      }
    }
    else {
      if (local_32 == InitRootFld) goto LAB_008a0a93;
      if (local_32 == LdRootFldForTypeOf) goto LAB_008a0a3f;
    }
LAB_008a0b93:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x79a,"(false)",
                                "The specified OpCode is not intended for patchable root field-access"
                               );
    if (!bVar2) goto LAB_008a0c4f;
    *puVar3 = 0;
  }
LAB_008a0ad3:
  bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,local_32,unit._4_4_,cacheId,isLoadMethod,isStore);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,local_32,unit._4_4_,cacheId,isLoadMethod,isStore), !bVar2)) &&
     (bVar2 = TryWriteElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,local_32,unit._4_4_,cacheId,isLoadMethod,isStore), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x79e,"(success)","success");
    if (!bVar2) {
LAB_008a0c4f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchableRootProperty(OpCode op, RegSlot value, uint cacheId, bool isLoadMethod, bool isStore, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementRootCP);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        Assert(!isLoadMethod || !isStore);

        value = ConsumeReg(value);

        switch (op)
        {
        case OpCode::LdRootFld:
        case OpCode::LdRootFldForTypeOf:
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::LdRootMethodFld:
            if (registerCacheIdForCall)
            {
                CacheIdUnit unit(cacheId, true);
                Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                callRegToLdFldCacheIndexMap->Add(value, unit);
            }
        case OpCode::StRootFld:
        case OpCode::StRootFldStrict:
        case OpCode::InitRootFld:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::InitRootLetFld:
        case OpCode::InitRootConstFld:
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable root field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementRootCP, op, value, cacheId, isLoadMethod, isStore);
    }